

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Own<kj::ConnectionReceiver> __thiscall
kj::anon_unknown_30::LowLevelAsyncIoProviderImpl::wrapListenSocketFd
          (LowLevelAsyncIoProviderImpl *this,int fd,NetworkFilter *filter,uint flags)

{
  _func_int **pp_Var1;
  undefined4 in_register_0000000c;
  ConnectionReceiver *extraout_RDX;
  undefined4 in_register_00000034;
  uint in_R8D;
  UnixEventPort *eventPort;
  Own<kj::ConnectionReceiver> OVar2;
  
  pp_Var1 = (_func_int **)operator_new(0x78);
  *pp_Var1 = (_func_int *)&PTR___cxa_pure_virtual_0064d158;
  OwnedFileDescriptor::OwnedFileDescriptor((OwnedFileDescriptor *)(pp_Var1 + 1),(int)filter,in_R8D);
  eventPort = (UnixEventPort *)(CONCAT44(in_register_00000034,fd) + 8);
  *pp_Var1 = (_func_int *)&PTR_accept_00651198;
  pp_Var1[2] = (_func_int *)eventPort;
  pp_Var1[3] = (_func_int *)CONCAT44(in_register_0000000c,flags);
  UnixEventPort::FdObserver::FdObserver((FdObserver *)(pp_Var1 + 4),eventPort,(int)filter,1);
  (this->super_LowLevelAsyncIoProvider)._vptr_LowLevelAsyncIoProvider =
       (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::FdConnectionReceiver>::instance
  ;
  (this->eventPort).super_EventPort._vptr_EventPort = pp_Var1;
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<ConnectionReceiver> wrapListenSocketFd(
      int fd, NetworkFilter& filter, uint flags = 0) override {
    return heap<FdConnectionReceiver>(eventPort, fd, filter, flags);
  }